

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.h
# Opt level: O1

void __thiscall CoreML::Specification::OneHotEncoder::clear_stringcategories(OneHotEncoder *this)

{
  ulong uVar1;
  StringVector *this_00;
  undefined8 *puVar2;
  
  if (this->_oneof_case_[0] == 1) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 == (undefined8 *)0x0) &&
       (this_00 = (this->CategoryType_).stringcategories_, this_00 != (StringVector *)0x0)) {
      StringVector::~StringVector(this_00);
      operator_delete(this_00,0x30);
    }
    this->_oneof_case_[0] = 0;
  }
  return;
}

Assistant:

inline bool OneHotEncoder::_internal_has_stringcategories() const {
  return CategoryType_case() == kStringCategories;
}